

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void rsg::(anonymous_namespace)::convertValueRange<int,float>
               (int srcMin,int srcMax,float *dstMin,float *dstMax)

{
  float fVar1;
  float *dstMax_local;
  float *dstMin_local;
  int srcMax_local;
  int srcMin_local;
  
  fVar1 = convert<int,float>(srcMin);
  *dstMin = fVar1;
  fVar1 = convert<int,float>(srcMax);
  *dstMax = fVar1;
  return;
}

Assistant:

inline void convertValueRange (SrcType srcMin, SrcType srcMax, DstType& dstMin, DstType& dstMax)
{
	dstMin = convert<SrcType, DstType>(srcMin);
	dstMax = convert<SrcType, DstType>(srcMax);
}